

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

void * ggml_malloc(size_t size)

{
  size_t in_RDI;
  undefined1 auVar1 [16];
  void *result;
  void *local_8;
  
  if (in_RDI == 0) {
    ggml_log_internal(GGML_LOG_LEVEL_WARN,
                      "Behavior may be unexpected when allocating 0 bytes for ggml_malloc!\n");
    local_8 = (void *)0x0;
  }
  else {
    local_8 = malloc(in_RDI);
    if (local_8 == (void *)0x0) {
      auVar1._8_4_ = (int)(in_RDI >> 0x20);
      auVar1._0_8_ = in_RDI;
      auVar1._12_4_ = 0x45300000;
      ggml_log_internal((ggml_log_level)
                        (((auVar1._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)in_RDI) - 4503599627370496.0)) /
                        1048576.0),(char *)0x4,"%s: failed to allocate %6.2f MB\n","ggml_malloc");
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml.c"
                 ,0x144,"fatal error");
    }
  }
  return local_8;
}

Assistant:

inline static void * ggml_malloc(size_t size) {
    if (size == 0) {
        GGML_LOG_WARN("Behavior may be unexpected when allocating 0 bytes for ggml_malloc!\n");
        return NULL;
    }
    void * result = malloc(size);
    if (result == NULL) {
        GGML_LOG_ERROR("%s: failed to allocate %6.2f MB\n", __func__, size/(1024.0*1024.0));
        GGML_ABORT("fatal error");
    }
    return result;
}